

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpd.cpp
# Opt level: O2

int __thiscall xmrig::Httpd::auth(Httpd *this,HttpData *req)

{
  size_t __n;
  pointer __s2;
  int iVar1;
  int iVar2;
  Config *pCVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  bool bVar6;
  allocator local_41;
  key_type local_40;
  
  pCVar3 = Base::config(this->m_base);
  std::__cxx11::string::string((string *)&local_40,"authorization",&local_41);
  sVar4 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&req->headers,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (sVar4 == 0) {
    iVar2 = 0x191;
    iVar1 = 200;
    if ((pCVar3->super_BaseConfig).m_http.m_token.m_data != (char *)0x0) {
      iVar1 = 0x191;
    }
    bVar6 = (pCVar3->super_BaseConfig).m_http.m_restricted == false;
  }
  else {
    if ((pCVar3->super_BaseConfig).m_http.m_token.m_data == (char *)0x0) {
      return 0x191;
    }
    std::__cxx11::string::string((string *)&local_40,"authorization",&local_41);
    pmVar5 = std::
             map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&req->headers,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (pmVar5->_M_string_length < 8) {
      return 0x193;
    }
    __n = (pCVar3->super_BaseConfig).m_http.m_token.m_size;
    if (__n != pmVar5->_M_string_length - 7) {
      return 0x193;
    }
    __s2 = (pmVar5->_M_dataplus)._M_p;
    iVar1 = bcmp("Bearer ",__s2,7);
    if (iVar1 != 0) {
      return 0x193;
    }
    iVar1 = strncmp((pCVar3->super_BaseConfig).m_http.m_token.m_data,__s2 + 7,__n);
    bVar6 = iVar1 == 0;
    iVar2 = 200;
    iVar1 = 0x193;
  }
  if (bVar6) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

int xmrig::Httpd::auth(const HttpData &req) const
{
    const Http &config = m_base->config()->http();

    if (!req.headers.count(kAuthorization)) {
        return config.isAuthRequired() ? HTTP_STATUS_UNAUTHORIZED : HTTP_STATUS_OK;
    }

    if (config.token().isNull()) {
        return HTTP_STATUS_UNAUTHORIZED;
    }

    const std::string &token = req.headers.at(kAuthorization);
    const size_t size        = token.size();

    if (token.size() < 8 || config.token().size() != size - 7 || memcmp("Bearer ", token.c_str(), 7) != 0) {
        return HTTP_STATUS_FORBIDDEN;
    }

    return strncmp(config.token().data(), token.c_str() + 7, config.token().size()) == 0 ? HTTP_STATUS_OK : HTTP_STATUS_FORBIDDEN;
}